

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

Solution * Utils::random_solution(void)

{
  bool bVar1;
  int iVar2;
  Vehicle *pVVar3;
  size_type sVar4;
  reference ppPVar5;
  reference ppVVar6;
  ulong uVar7;
  int local_a8;
  int local_a4;
  int ec_1;
  int i;
  Vehicle *vehicle;
  iterator __end2;
  iterator __begin2;
  list<Vehicle_*,_std::allocator<Vehicle_*>_> *__range2;
  iterator iStack_78;
  int ec;
  const_iterator local_70;
  Point *local_68;
  Point *p;
  iterator pit;
  iterator local_50;
  const_iterator local_48;
  undefined1 local_40 [8];
  list<Point_*,_std::allocator<Point_*>_> point_pool;
  Vehicle *local_18;
  Vehicle *v;
  Solution *solution;
  
  pVVar3 = (Vehicle *)operator_new(0x20);
  Solution::Solution((Solution *)pVVar3);
  v = pVVar3;
  pVVar3 = (Vehicle *)operator_new(0x28);
  Vehicle::Vehicle(pVVar3,(Solution *)v);
  local_18 = pVVar3;
  std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back
            ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)v,&local_18);
  std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::list
            ((list<Point_*,_std::allocator<Point_*>_> *)local_40,&raw_rows_abi_cxx11_);
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::begin
                 ((list<Point_*,_std::allocator<Point_*>_> *)local_40);
  std::_List_const_iterator<Point_*>::_List_const_iterator(&local_48,&local_50);
  pit = std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::erase
                  ((list<Point_*,_std::allocator<Point_*>_> *)local_40,local_48);
LAB_00110104:
  do {
    bVar1 = std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::empty
                      ((list<Point_*,_std::allocator<Point_*>_> *)local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Solution::total_weight((Solution *)v);
      pVVar3 = v;
      std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::~list
                ((list<Point_*,_std::allocator<Point_*>_> *)local_40);
      return (Solution *)pVVar3;
    }
    p = (Point *)std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::begin
                           ((list<Point_*,_std::allocator<Point_*>_> *)local_40);
    iVar2 = rand();
    sVar4 = std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::size
                      ((list<Point_*,_std::allocator<Point_*>_> *)local_40);
    std::advance<std::_List_iterator<Point*>,unsigned_long>
              ((_List_iterator<Point_*> *)&p,(ulong)(long)iVar2 % sVar4);
    ppPVar5 = std::_List_iterator<Point_*>::operator*((_List_iterator<Point_*> *)&p);
    local_68 = *ppPVar5;
    std::_List_const_iterator<Point_*>::_List_const_iterator(&local_70,(iterator *)&p);
    iStack_78 = std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::erase
                          ((list<Point_*,_std::allocator<Point_*>_> *)local_40,local_70);
    pVVar3 = v;
    __range2._4_4_ = 0;
    __end2 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin
                       ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)v);
    vehicle = (Vehicle *)
              std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::end
                        ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)pVVar3);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&vehicle), bVar1) {
      ppVVar6 = std::_List_iterator<Vehicle_*>::operator*(&__end2);
      _ec_1 = *ppVVar6;
      for (local_a4 = 0; uVar7 = (ulong)local_a4,
          sVar4 = std::__cxx11::
                  list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                  ::size(&_ec_1->nodes), uVar7 <= sVar4; local_a4 = local_a4 + 1) {
        __range2._4_4_ = 0;
        Vehicle::add_node(_ec_1,local_68,local_a4,(int *)((long)&__range2 + 4));
        if (__range2._4_4_ == 0) goto LAB_00110104;
      }
      std::_List_iterator<Vehicle_*>::operator++(&__end2);
    }
    if (__range2._4_4_ != 0) {
      pVVar3 = (Vehicle *)operator_new(0x28);
      Vehicle::Vehicle(pVVar3,(Solution *)v);
      local_18 = pVVar3;
      std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back
                ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)v,&local_18);
      local_a8 = 0;
      Vehicle::add_node(local_18,local_68,0,&local_a8);
    }
  } while( true );
}

Assistant:

Solution *Utils::random_solution() {
    auto solution = new Solution;
    auto v = new Vehicle(solution);
    solution->vehicles.push_back(v);

    auto point_pool = Utils::raw_rows;
    point_pool.erase(point_pool.begin());
    while (!point_pool.empty()) {
        auto pit = point_pool.begin();
        std::advance(pit, rand() % point_pool.size());
        auto p = *pit;
        point_pool.erase(pit);
        auto ec = 0;
        for (auto vehicle: solution->vehicles) {
            for (auto i = 0; i <= vehicle->nodes.size(); ++i) {
                ec = 0;
                vehicle->add_node(p, i, ec);
                if (ec == 0)
                    goto leave;
            }
        }

        if (ec != 0) {
            v = new Vehicle(solution);
            solution->vehicles.push_back(v);
            auto ec = 0;
            v->add_node(p, 0, ec);
        }
        leave:;
    }
    solution->total_weight();
    return solution;
}